

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O1

int trico_read_triangles(void *a,uint32_t **triangles)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  uint *puVar4;
  bool bVar5;
  uint uVar6;
  char *pcVar7;
  uint8_t *b1;
  uint8_t *b2;
  uint8_t *b3;
  uint8_t *b4;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint unaff_R13D;
  uint local_58;
  uint local_54;
  
  iVar8 = 0;
  iVar9 = 0;
  if (*(int *)((long)a + 0x24) == 3) {
    iVar2 = *(int *)((long)a + 0x40);
    bVar5 = true;
    if ((iVar2 == 0) &&
       (piVar3 = *(int **)((long)a + 0x18),
       (ulong)((long)piVar3 + (4 - *(long *)((long)a + 0x10))) <= *(ulong *)((long)a + 0x30))) {
      iVar9 = *piVar3;
      *(int **)((long)a + 0x18) = piVar3 + 1;
      local_54 = iVar9 * 3;
      bVar5 = false;
    }
    iVar9 = iVar8;
    if (!bVar5) {
      bVar5 = true;
      local_58 = unaff_R13D;
      if ((iVar2 == 0) &&
         (puVar4 = *(uint **)((long)a + 0x18),
         (ulong)((long)puVar4 + (4 - *(long *)((long)a + 0x10))) <= *(ulong *)((long)a + 0x30))) {
        local_58 = *puVar4;
        *(uint **)((long)a + 0x18) = puVar4 + 1;
        bVar5 = false;
      }
      if (!bVar5) {
        uVar11 = (ulong)local_58;
        pcVar7 = (char *)malloc(uVar11);
        if (iVar2 == 0) {
          lVar1 = (long)*(void **)((long)a + 0x18) + uVar11;
          if ((ulong)(lVar1 - *(long *)((long)a + 0x10)) <= *(ulong *)((long)a + 0x30)) {
            memcpy(pcVar7,*(void **)((long)a + 0x18),uVar11);
            *(long *)((long)a + 0x18) = lVar1;
            uVar11 = (ulong)local_54;
            b1 = (uint8_t *)malloc(uVar11);
            uVar6 = LZ4_decompress_safe(pcVar7,(char *)b1,local_58,local_54);
            if (uVar6 != local_54) {
              __assert_fail("bytes_decompressed == nr_of_triangles * 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                            ,0x44e,"int trico_read_triangles(void *, uint32_t **)");
            }
            iVar8 = *(int *)((long)a + 0x40);
            bVar5 = true;
            if ((iVar8 == 0) &&
               (puVar4 = *(uint **)((long)a + 0x18),
               (ulong)((long)puVar4 + (4 - *(long *)((long)a + 0x10))) <= *(ulong *)((long)a + 0x30)
               )) {
              local_58 = *puVar4;
              *(uint **)((long)a + 0x18) = puVar4 + 1;
              bVar5 = false;
            }
            if (!bVar5) {
              uVar10 = (ulong)local_58;
              pcVar7 = (char *)realloc(pcVar7,uVar10);
              if (iVar8 == 0) {
                lVar1 = (long)*(void **)((long)a + 0x18) + uVar10;
                if ((ulong)(lVar1 - *(long *)((long)a + 0x10)) <= *(ulong *)((long)a + 0x30)) {
                  memcpy(pcVar7,*(void **)((long)a + 0x18),uVar10);
                  *(long *)((long)a + 0x18) = lVar1;
                  b2 = (uint8_t *)malloc(uVar11);
                  uVar6 = LZ4_decompress_safe(pcVar7,(char *)b2,local_58,local_54);
                  if (uVar6 != local_54) {
                    __assert_fail("bytes_decompressed == nr_of_triangles * 3",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                  ,0x457,"int trico_read_triangles(void *, uint32_t **)");
                  }
                  iVar8 = *(int *)((long)a + 0x40);
                  bVar5 = true;
                  if ((iVar8 == 0) &&
                     (puVar4 = *(uint **)((long)a + 0x18),
                     (ulong)((long)puVar4 + (4 - *(long *)((long)a + 0x10))) <=
                     *(ulong *)((long)a + 0x30))) {
                    local_58 = *puVar4;
                    *(uint **)((long)a + 0x18) = puVar4 + 1;
                    bVar5 = false;
                  }
                  if (!bVar5) {
                    uVar10 = (ulong)local_58;
                    pcVar7 = (char *)realloc(pcVar7,uVar10);
                    if (iVar8 == 0) {
                      lVar1 = (long)*(void **)((long)a + 0x18) + uVar10;
                      if ((ulong)(lVar1 - *(long *)((long)a + 0x10)) <= *(ulong *)((long)a + 0x30))
                      {
                        memcpy(pcVar7,*(void **)((long)a + 0x18),uVar10);
                        *(long *)((long)a + 0x18) = lVar1;
                        b3 = (uint8_t *)malloc(uVar11);
                        uVar6 = LZ4_decompress_safe(pcVar7,(char *)b3,local_58,local_54);
                        if (uVar6 != local_54) {
                          __assert_fail("bytes_decompressed == nr_of_triangles * 3",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                        ,0x460,"int trico_read_triangles(void *, uint32_t **)");
                        }
                        iVar8 = *(int *)((long)a + 0x40);
                        bVar5 = true;
                        if ((iVar8 == 0) &&
                           (puVar4 = *(uint **)((long)a + 0x18),
                           (ulong)((long)puVar4 + (4 - *(long *)((long)a + 0x10))) <=
                           *(ulong *)((long)a + 0x30))) {
                          local_58 = *puVar4;
                          *(uint **)((long)a + 0x18) = puVar4 + 1;
                          bVar5 = false;
                        }
                        if (!bVar5) {
                          uVar10 = (ulong)local_58;
                          pcVar7 = (char *)realloc(pcVar7,uVar10);
                          if (iVar8 == 0) {
                            lVar1 = (long)*(void **)((long)a + 0x18) + uVar10;
                            if ((ulong)(lVar1 - *(long *)((long)a + 0x10)) <=
                                *(ulong *)((long)a + 0x30)) {
                              memcpy(pcVar7,*(void **)((long)a + 0x18),uVar10);
                              *(long *)((long)a + 0x18) = lVar1;
                              b4 = (uint8_t *)malloc(uVar11);
                              uVar6 = LZ4_decompress_safe(pcVar7,(char *)b4,local_58,local_54);
                              if (uVar6 != local_54) {
                                __assert_fail("bytes_decompressed == nr_of_triangles * 3",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                              ,0x469,"int trico_read_triangles(void *, uint32_t **)"
                                             );
                              }
                              if (triangles != (uint32_t **)0x0) {
                                trico_transpose_uint32_soa_to_aos(triangles,b1,b2,b3,b4,local_54);
                              }
                              free(pcVar7);
                              free(b1);
                              free(b2);
                              free(b3);
                              free(b4);
                              read_next_stream_type((trico_archive *)a);
                              iVar9 = 1;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar9;
}

Assistant:

int trico_read_triangles(void* a, uint32_t** triangles)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != trico_triangle_uint32_stream)
    return 0;

  uint32_t nr_of_triangles;
  if (!read(&nr_of_triangles, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b1 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint32_t bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b1, nr_of_compressed_bytes, nr_of_triangles * 3);
  assert(bytes_decompressed == nr_of_triangles * 3);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b2 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b2, nr_of_compressed_bytes, nr_of_triangles * 3);
  assert(bytes_decompressed == nr_of_triangles * 3);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b3 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b3, nr_of_compressed_bytes, nr_of_triangles * 3);
  assert(bytes_decompressed == nr_of_triangles * 3);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b4 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b4, nr_of_compressed_bytes, nr_of_triangles * 3);
  assert(bytes_decompressed == nr_of_triangles * 3);

  if (triangles != NULL)
    trico_transpose_uint32_soa_to_aos(triangles, decompressed_b1, decompressed_b2, decompressed_b3, decompressed_b4, nr_of_triangles * 3);

  trico_free(compressed);
  trico_free(decompressed_b1);
  trico_free(decompressed_b2);
  trico_free(decompressed_b3);
  trico_free(decompressed_b4);

  read_next_stream_type(arch);

  return 1;
  }